

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

void moira::sprintx(char **s,u64 value,DasmNumberFormat *fmt,int digits)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  ulong uVar4;
  char cVar5;
  int i;
  uint uVar6;
  long lVar7;
  
  bVar1 = fmt->upperCase;
  if ((value != 0) || (fmt->plainZero == false)) {
    for (lVar7 = 0; cVar2 = fmt->prefix[lVar7], cVar2 != '\0'; lVar7 = lVar7 + 1) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = cVar2;
    }
  }
  for (uVar4 = (ulong)(uint)digits; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    uVar6 = (uint)value & 0xf;
    cVar2 = (char)uVar6;
    cVar5 = cVar2 + '0';
    if (9 < uVar6) {
      cVar5 = cVar2 + (bVar1 ^ 1U) * ' ' + '7';
    }
    (*s)[uVar4 - 1] = cVar5;
    value = value >> 4;
  }
  *s = *s + digits;
  return;
}

Assistant:

static void sprintx(char *&s, u64 value, const DasmNumberFormat &fmt, int digits)
{
    char a = (fmt.upperCase ? 'A' : 'a') - 10;

    if (value || !fmt.plainZero) {

        for (int i = 0; fmt.prefix[i]; i++) *s++ = fmt.prefix[i];
    }
    for (int i = digits - 1; i >= 0; i--) {

        auto digit = char(value % 16);
        s[i] = (digit <= 9) ? ('0' + digit) : (a + digit);
        value /= 16;
    }
    s += digits;
}